

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O1

void __thiscall Args::Arg::process(Arg *this,Context *context)

{
  size_type *psVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  logic_error *this_00;
  pointer pbVar6;
  ulong *puVar7;
  ulong uVar8;
  CmdLine *cmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [32];
  ulong *local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  CmdLine *local_60;
  ulong local_58 [2];
  String local_48;
  
  iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[6])();
  if ((char)iVar3 != '\0') {
    this_00 = (logic_error *)__cxa_allocate_exception(0x30);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Argument \"","");
    (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_e8,this);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &local_e8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_a8 = (ulong *)*plVar5;
    puVar7 = (ulong *)(plVar5 + 2);
    if (local_a8 == puVar7) {
      local_98 = *puVar7;
      uStack_90 = plVar5[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar7;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
    *(undefined ***)this_00 = &PTR__BaseException_001725a0;
    *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
    if (local_a8 == &local_98) {
      *(undefined4 *)(this_00 + 0x20) = (undefined4)local_98;
      *(undefined4 *)(this_00 + 0x24) = local_98._4_4_;
      *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_90;
      *(undefined4 *)(this_00 + 0x2c) = uStack_90._4_4_;
    }
    else {
      *(ulong **)(this_00 + 0x10) = local_a8;
      *(ulong *)(this_00 + 0x20) = local_98;
    }
    *(long *)(this_00 + 0x18) = local_a0;
    local_a0 = 0;
    local_98 = local_98 & 0xffffffffffffff00;
    local_a8 = &local_98;
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[4])(this);
  if ((char)iVar3 == '\0') goto LAB_0013c249;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Argument \"","");
  (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_88,this);
  uVar2 = (long)&(local_60->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API + local_80;
  uVar8 = 0xf;
  if (local_68 != local_58) {
    uVar8 = local_58[0];
  }
  if (uVar8 < uVar2) {
    uVar8 = 0xf;
    if (local_88 != local_78) {
      uVar8 = local_78[0];
    }
    if (uVar8 < uVar2) goto LAB_0013c0d3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
    cmdLine = local_60;
  }
  else {
LAB_0013c0d3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
    cmdLine = local_60;
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_e8.field_2._M_allocated_capacity = *psVar1;
    local_e8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar1;
    local_e8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_e8._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
  pbVar6 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar6) {
    local_c8._16_8_ = (pbVar6->_M_dataplus)._M_p;
    local_c8._24_8_ = plVar5[3];
    local_c8._0_8_ = (pointer)(local_c8 + 0x10);
  }
  else {
    local_c8._16_8_ = (pbVar6->_M_dataplus)._M_p;
    local_c8._0_8_ = (pointer)*plVar5;
  }
  local_c8._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  eatOneValue<Args::CmdLine,Args::Context>
            (&local_48,(Args *)context,(Context *)local_c8,
             (String *)(this->super_ArgIface).m_cmdLine,cmdLine);
  (*(this->super_ArgIface)._vptr_ArgIface[0x14])(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
LAB_0013c249:
  this->m_isDefined = true;
  return;
}

Assistant:

inline void
Arg::process( Context & context )
{
	if( !isDefined() )
	{
		if( !isWithValue() )
			setDefined( true );
		else
		{
			setValue( eatOneValue( context,
				String( SL( "Argument \"" ) ) +	name() +
					SL( "\" requires value that wasn't presented." ),
				cmdLine() ) );

			setDefined( true );
		}
	}
	else
		throw BaseException( String( SL( "Argument \"" ) ) +
			name() + SL( "\" already defined." ) );
}